

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistoryTrackerTests.cpp
# Opt level: O2

void __thiscall
solitaire::archivers::FullHistoryTrackerTests_onUndoRestoreSnapshotsInReverseOrder_Test::
FullHistoryTrackerTests_onUndoRestoreSnapshotsInReverseOrder_Test
          (FullHistoryTrackerTests_onUndoRestoreSnapshotsInReverseOrder_Test *this)

{
  FullHistoryTrackerTests::FullHistoryTrackerTests(&this->super_FullHistoryTrackerTests);
  (this->super_FullHistoryTrackerTests).super_HistoryTrackerWithOneSnapshotTests.
  super_HistoryTrackerTests.super_Test._vptr_Test =
       (_func_int **)&PTR__FullHistoryTrackerTests_002ef7b8;
  return;
}

Assistant:

TEST_F(FullHistoryTrackerTests, onUndoRestoreSnapshotsInReverseOrder) {
    EXPECT_CALL(*snapshotMock2, restore());
    historyTracker.undo();
    EXPECT_EQ(historyTracker.getHistorySize(), 1);

    EXPECT_CALL(*snapshotMock, restore());
    historyTracker.undo();
    EXPECT_EQ(historyTracker.getHistorySize(), 0);
}